

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

bool __thiscall amrex::Amr::writeSmallPlotNow(Amr *this)

{
  double dVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  Real __x;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  
  dVar7 = this->small_plot_per;
  bVar6 = false;
  if (0.0 < dVar7) {
    dVar1 = this->cumtime;
    dVar8 = dVar1 - *(this->dt_level).super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
    auVar9._8_8_ = dVar8;
    auVar9._0_8_ = dVar1;
    auVar10._8_4_ = SUB84(dVar7,0);
    auVar10._0_8_ = dVar7;
    auVar10._12_4_ = (int)((ulong)dVar7 >> 0x20);
    auVar10 = divpd(auVar9,auVar10);
    iVar11 = (int)auVar10._8_8_;
    iVar4 = iVar11 + 1;
    iVar5 = (int)auVar10._0_8_;
    if ((((int)auVar10._0_8_ == iVar11) &&
        (iVar5 = iVar4, iVar3 = iVar11,
        ABS(dVar1) * 2.220446049250313e-15 < ABS(dVar1 - (double)iVar4 * dVar7))) ||
       (iVar3 = iVar5, ABS(dVar1) * 2.220446049250313e-15 < ABS(dVar8 - (double)iVar4 * dVar7))) {
      iVar5 = iVar3;
      iVar4 = iVar11;
    }
    bVar6 = iVar4 != iVar5;
  }
  if (0.0 < this->small_plot_log_per) {
    __x = this->cumtime;
    dVar7 = *(this->dt_level).super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    iVar4 = 0;
    if (__x <= dVar7) {
      iVar5 = 0;
    }
    else {
      dVar7 = log10(__x - dVar7);
      iVar5 = (int)(dVar7 / this->small_plot_log_per);
      __x = this->cumtime;
    }
    if (0.0 < __x) {
      dVar7 = log10(__x);
      iVar4 = (int)(dVar7 / this->small_plot_log_per);
    }
    if (iVar5 != iVar4) {
      bVar6 = true;
    }
  }
  if (this->small_plot_int < 1) {
    if (bVar6) {
      return (bool)1;
    }
  }
  else {
    if (bVar6) {
      return (bool)1;
    }
    if (*(this->level_steps).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start %
        this->small_plot_int == 0) {
      return (bool)1;
    }
  }
  uVar2 = (**(code **)(*(long *)(((this->amr_level).
                                  super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                  .
                                  super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                      + 0x140))();
  return (bool)uVar2;
}

Assistant:

bool
Amr::writeSmallPlotNow() noexcept
{
    int plot_test = 0;
    if (small_plot_per > 0.0)
    {

        // Check to see if we've crossed a small_plot_per interval by comparing
        // the number of intervals that have elapsed for both the current
        // time and the time at the beginning of this timestep.

        int num_per_old = static_cast<int>((cumtime-dt_level[0]) / small_plot_per);
        int num_per_new = static_cast<int>((cumtime            ) / small_plot_per);

        // Before using these, however, we must test for the case where we're
        // within machine epsilon of the next interval. In that case, increment
        // the counter, because we have indeed reached the next small_plot_per interval
        // at this point.

        const Real eps = std::numeric_limits<Real>::epsilon() * 10.0_rt * std::abs(cumtime);
        const Real next_plot_time = (num_per_old + 1) * small_plot_per;

        if ((num_per_new == num_per_old) && std::abs(cumtime - next_plot_time) <= eps)
        {
            num_per_new += 1;
        }

        // Similarly, we have to account for the case where the old time is within
        // machine epsilon of the beginning of this interval, so that we don't double
        // count that time threshold -- we already plotted at that time on the last timestep.

        if ((num_per_new != num_per_old) && std::abs((cumtime - dt_level[0]) - next_plot_time) <= eps)
        {
            num_per_old += 1;
        }

        if (num_per_old != num_per_new)
        {
            plot_test = 1;
        }

    }

    if (small_plot_log_per > 0.0)
    {

        // Check to see if we've crossed a small_plot_log_per interval by comparing
        // the number of intervals that have elapsed for both the current
        // time and the time at the beginning of this timestep.
        // This only works when cumtime > 0.

        int num_per_old = 0;
        int num_per_new = 0;

        if (cumtime-dt_level[0] > 0.) {
            num_per_old = static_cast<int>(std::log10(cumtime-dt_level[0]) / small_plot_log_per);
        }
        if (cumtime > 0.) {
            num_per_new = static_cast<int>(std::log10(cumtime) / small_plot_log_per);
        }

        if (num_per_old != num_per_new)
        {
            plot_test = 1;
        }

    }

    return ( (small_plot_int > 0 && level_steps[0] % small_plot_int == 0) ||
              plot_test == 1 ||
              amr_level[0]->writeSmallPlotNow());
}